

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O2

bool __thiscall
Indexing::ClauseCodeTree::ClauseMatcher::compatible
          (ClauseMatcher *this,ILStruct *bi,MatchInfo *bq,ILStruct *ni,MatchInfo *nq)

{
  uint *puVar1;
  MatchInfo *pMVar2;
  LitInfo *pLVar3;
  uint uVar4;
  bool bVar5;
  uint *puVar6;
  uint *puVar7;
  MatchInfo *pMVar8;
  uint uVar9;
  uint *puVar10;
  uint uVar11;
  MatchInfo *pMVar12;
  long lVar13;
  MatchInfo *pMVar14;
  long lVar15;
  uint uVar16;
  
  pLVar3 = (this->lInfos)._array;
  if ((pLVar3[*(uint *)bq].litIndex == pLVar3[*(uint *)nq].litIndex) ||
     ((pLVar3[*(uint *)bq].opposite == true && (pLVar3[*(uint *)nq].opposite != false)))) {
LAB_0026c468:
    bVar5 = false;
  }
  else {
    uVar16 = bi->varCnt;
    puVar10 = bi->sortedGlobalVarNumbers;
    pMVar8 = bq + 8;
    puVar7 = ni->sortedGlobalVarNumbers;
    pMVar12 = nq + 8;
    for (uVar11 = ni->varCnt; (bVar5 = true, uVar16 != 0 && (uVar11 != 0)); uVar11 = uVar11 - uVar9)
    {
      uVar4 = uVar16;
      while( true ) {
        if (uVar4 == 0) {
          return true;
        }
        if (*puVar7 <= *puVar10) break;
        puVar10 = puVar10 + 1;
        pMVar8 = pMVar8 + 8;
        uVar4 = uVar4 - 1;
      }
      puVar1 = puVar7 + uVar11;
      pMVar2 = pMVar12 + (ulong)uVar11 * 8;
      for (; (puVar6 = puVar1, pMVar14 = pMVar2, uVar11 != 0 &&
             (puVar6 = puVar7, pMVar14 = pMVar12, *puVar7 < *puVar10)); puVar7 = puVar7 + 1) {
        pMVar12 = pMVar12 + 8;
        uVar11 = uVar11 - 1;
      }
      lVar13 = 0;
      uVar9 = 0;
      for (lVar15 = 0;
          ((uVar16 = uVar4 - uVar9, uVar16 != 0 && (uVar11 != uVar9)) &&
          (*(int *)((long)puVar10 + lVar15) == *(int *)((long)puVar6 + lVar15)));
          lVar15 = lVar15 + 4) {
        if (*(long *)(pMVar8 + lVar15 * 2) != *(long *)(pMVar14 + lVar15 * 2)) goto LAB_0026c468;
        uVar9 = uVar9 + 1;
        lVar13 = lVar13 + -8;
      }
      puVar10 = (uint *)((long)puVar10 + lVar15);
      pMVar8 = pMVar8 + -lVar13;
      puVar7 = (uint *)((long)puVar6 + lVar15);
      pMVar12 = pMVar14 + -lVar13;
    }
  }
  return bVar5;
}

Assistant:

bool ClauseCodeTree::ClauseMatcher::compatible(ILStruct* bi, MatchInfo* bq, ILStruct* ni, MatchInfo* nq)
{
  if( lInfos[bq->liIndex].litIndex==lInfos[nq->liIndex].litIndex ||
      (lInfos[bq->liIndex].opposite && lInfos[nq->liIndex].opposite) ) {
    return false;
  }

  unsigned bvars=bi->varCnt;
  unsigned* bgvn=bi->sortedGlobalVarNumbers;
  TermList* bb=bq->bindings;

  unsigned nvars=ni->varCnt;
  unsigned* ngvn=ni->sortedGlobalVarNumbers;
  TermList* nb=nq->bindings;

  while(bvars && nvars) {
    while(bvars && *bgvn<*ngvn) {
      bvars--;
      bgvn++;
      bb++;
    }
    if(!bvars) {
      break;
    }
    while(nvars && *bgvn>*ngvn) {
      nvars--;
      ngvn++;
      nb++;
    }
    while(bvars && nvars && *bgvn==*ngvn) {
      if(*bb!=*nb) {
	return false;
      }
      bvars--;
      bgvn++;
      bb++;
      nvars--;
      ngvn++;
      nb++;
    }
  }

  return true;
}